

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP.h
# Opt level: O3

value_type_conflict1 __thiscall
CCDPP::rank_one_update
          (CCDPP *this,SparseMatrix *_R,value_type_conflict1 *to_update,
          value_type_conflict1 *the_other,int workload)

{
  pool *ppVar1;
  double *pdVar2;
  int iVar3;
  vector<double,_std::allocator<double>_> fun_dec;
  allocator_type local_85;
  int local_84;
  double local_80;
  value_type_conflict1 *local_78;
  value_type_conflict1 *local_70;
  vector<double,_std::allocator<double>_> local_68;
  function0<void> local_50;
  
  local_50.super_function_base.vtable = (vtable_base *)0x0;
  local_84 = workload;
  local_78 = the_other;
  local_70 = to_update;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_68,(long)this->parameter->num_of_thread,(value_type_conflict1 *)&local_50,
             &local_85);
  if (0 < this->parameter->num_of_thread) {
    iVar3 = 0;
    do {
      ppVar1 = this->thread_pool;
      local_50.super_function_base.functor.members.obj_ref.obj_ptr = operator_new(0x38);
      local_50.super_function_base.vtable =
           (vtable_base *)
           _ZZN5boost9function0IvE9assign_toISt5_BindIFZN5CCDPP15rank_one_updateER12SparseMatrixPdS7_iEUliE_iEEEEvT_E13stored_vtable
      ;
      *(int **)local_50.super_function_base.functor.members._0_8_ = &local_84;
      *(SparseMatrix **)((long)local_50.super_function_base.functor.members._0_8_ + 8) = _R;
      *(CCDPP **)((long)local_50.super_function_base.functor.members._0_8_ + 0x10) = this;
      *(value_type_conflict1 ***)((long)local_50.super_function_base.functor.members._0_8_ + 0x18) =
           &local_78;
      *(value_type_conflict1 ***)((long)local_50.super_function_base.functor.members._0_8_ + 0x20) =
           &local_70;
      *(vector<double,_std::allocator<double>_> **)
       ((long)local_50.super_function_base.functor.members._0_8_ + 0x28) = &local_68;
      *(int *)((long)local_50.super_function_base.functor.members._0_8_ + 0x30) = iVar3;
      boost::threadpool::detail::
      pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
      ::schedule((ppVar1->m_core).px,&local_50);
      boost::function0<void>::~function0(&local_50);
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->parameter->num_of_thread);
  }
  boost::threadpool::detail::
  pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  ::wait((this->thread_pool->m_core).px,(void *)0x0);
  local_80 = 0.0;
  for (pdVar2 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar2 != local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
    local_80 = local_80 + *pdVar2;
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return local_80;
}

Assistant:

inline value_type rank_one_update(SparseMatrix &_R, value_type *to_update, value_type *the_other, const int workload) {

        vector<value_type> fun_dec(parameter->num_of_thread, 0);

        for (int thread_index = 0; thread_index < parameter->num_of_thread; thread_index++) {
            thread_pool->schedule(std::bind([&](const int thread_index) {
                int start = workload * thread_index;
                int end = std::min(workload + start, _R.num_of_cols);

                value_type prev_value;

                for (int col = start; col < end; col++) {
                    // empty column
                    if (_R.ccs_col_ptr[col + 1] == _R.ccs_col_ptr[col]) {
                        continue;
                    }

                    value_type numerator = 0;
                    value_type denominator = parameter->lambda * (_R.ccs_col_ptr[col + 1] -
                                                                  _R.ccs_col_ptr[col]);

                    for (int idx = _R.ccs_col_ptr[col]; idx < _R.ccs_col_ptr[col + 1]; idx++) {
                        int i = _R.ccs_row_idx[idx];
                        numerator += the_other[i] * _R.ccs_rating_scores[idx];
                        denominator += the_other[i] * the_other[i];
                    }

                    prev_value = to_update[col];
                    to_update[col] = numerator / denominator;

                    fun_dec[thread_index] += denominator * sqr(prev_value - to_update[col]);
                }
            }, thread_index));
        }

        thread_pool->wait();

        value_type result = 0;
        for (auto value:fun_dec) {
            result += value;
        }
        return result;
    }